

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_match.h
# Opt level: O0

int __thiscall
booster::
sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::compare(sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *this,sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *other)

{
  int iVar1;
  string local_50 [32];
  string local_30 [8];
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffd8;
  
  str(in_stack_ffffffffffffffd8);
  str(in_stack_ffffffffffffffd8);
  iVar1 = std::__cxx11::string::compare(local_30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return iVar1;
}

Assistant:

int compare(sub_match const &other) const
		{
			return str().compare(other.str());
		}